

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EfiTianoDecompress.c
# Opt level: O2

UINT16 MakeTable(SCRATCH_DATA *Sd,UINT16 NumOfChar,UINT8 *BitLen,UINT16 TableBits,UINT16 *Table)

{
  byte bVar1;
  UINT16 UVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  byte bVar6;
  ushort uVar7;
  short sVar8;
  char cVar9;
  byte bVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  ushort uVar14;
  ushort uVar15;
  UINT16 *pUVar16;
  ulong uVar17;
  uint uVar18;
  UINT16 Start [18];
  UINT16 Weight [17];
  UINT16 Count [17];
  
  for (lVar4 = 0; lVar4 != 0x11; lVar4 = lVar4 + 1) {
    Count[lVar4] = 0;
  }
  uVar12 = (ulong)NumOfChar;
  for (uVar5 = 0; uVar12 != uVar5; uVar5 = uVar5 + 1) {
    if (0x10 < (ulong)BitLen[uVar5]) {
      return 0xffff;
    }
    Count[BitLen[uVar5]] = Count[BitLen[uVar5]] + 1;
  }
  Start[0] = 0;
  Start[1] = 0;
  bVar6 = 0xf;
  for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
    Start[lVar4 + 2] = (Count[lVar4 + 1] << (bVar6 & 0x1f)) + Start[lVar4 + 1];
    bVar6 = bVar6 - 1;
  }
  UVar2 = 0xffff;
  if (Start[0x11] == 0) {
    bVar1 = (byte)TableBits;
    bVar6 = 0x10 - bVar1;
    Weight[0] = 0;
    cVar9 = -0xf;
    UVar2 = TableBits;
    for (uVar5 = 1; UVar2 = UVar2 - 1, uVar5 <= TableBits; uVar5 = uVar5 + 1) {
      Start[uVar5] = Start[uVar5] >> (bVar6 & 0x1f);
      Weight[uVar5] = (UINT16)(1 << ((byte)UVar2 & 0x1f));
      cVar9 = cVar9 + '\x01';
    }
    bVar10 = -cVar9;
    for (; uVar5 < 0x11; uVar5 = uVar5 + 1) {
      Weight[uVar5] = (UINT16)(1 << (bVar10 & 0x1f));
      bVar10 = bVar10 - 1;
    }
    uVar15 = Start[(ulong)TableBits + 1] >> (bVar6 & 0x1f);
    uVar11 = (uint)uVar15;
    uVar13 = 1 << (bVar1 & 0x1f);
    uVar18 = uVar13 & 0xffff;
    iVar3 = uVar18 - uVar11;
    if ((uVar11 <= uVar18 && iVar3 != 0) && uVar15 != 0) {
      SetMem16(Table + uVar11,(long)iVar3 * 2,0 >> (bVar6 & 0x1f));
    }
    for (uVar5 = 0; uVar5 != uVar12; uVar5 = uVar5 + 1) {
      bVar10 = BitLen[uVar5];
      if (0xef < (byte)(bVar10 - 0x11)) {
        uVar15 = *(ushort *)((long)Start + (ulong)((uint)bVar10 + (uint)bVar10));
        uVar17 = (ulong)uVar15;
        uVar7 = *(short *)((long)Weight + (ulong)((uint)bVar10 + (uint)bVar10)) + uVar15;
        if (TableBits < bVar10) {
          pUVar16 = Table + (uVar15 >> (bVar6 & 0x1f));
          for (sVar8 = TableBits - bVar10; sVar8 != 0; sVar8 = sVar8 + 1) {
            uVar14 = *pUVar16;
            if (NumOfChar < 0x3fb && uVar14 == 0) {
              *(undefined2 *)((long)Sd->mLeft + (ulong)((uint)NumOfChar * 2)) = 0;
              *(undefined2 *)((long)Sd->mRight + (ulong)((uint)NumOfChar * 2)) = 0;
              *pUVar16 = NumOfChar;
              uVar14 = NumOfChar;
              NumOfChar = NumOfChar + 1;
LAB_0012cb83:
              if ((uVar15 & (ushort)(0x8000 >> (bVar1 & 0x1f))) == 0) {
                pUVar16 = Sd->mLeft + uVar14;
              }
              else {
                pUVar16 = Sd->mRight + uVar14;
              }
            }
            else if (uVar14 < 0x3fb) goto LAB_0012cb83;
            uVar15 = uVar15 * 2;
          }
          *pUVar16 = (ushort)uVar5;
        }
        else {
          for (; uVar17 < uVar7; uVar17 = uVar17 + 1) {
            if ((uVar13 & 0xffff) <= uVar17) {
              return 0xffff;
            }
            Table[uVar17] = (ushort)uVar5;
          }
        }
        Start[bVar10] = uVar7;
      }
    }
    UVar2 = 0;
  }
  return UVar2;
}

Assistant:

STATIC
UINT16
MakeTable (
    IN  SCRATCH_DATA  *Sd,
    IN  UINT16        NumOfChar,
    IN  UINT8         *BitLen,
    IN  UINT16        TableBits,
    OUT UINT16        *Table
    )
{
    UINT16  Count[17];
    UINT16  Weight[17];
    UINT16  Start[18];
    UINT16  *Pointer;
    UINT16  Index3;
    UINT16  Index;
    UINT16  Len;
    UINT16  Char;
    UINT16  JuBits;
    UINT16  Avail;
    UINT16  NextCode;
    UINT16  Mask;
    UINT16  WordOfStart;
    UINT16  WordOfCount;
    UINT16  MaxTableLength;

    //
    // The maximum mapping table width supported by this internal
    // working function is 16.
    //
    if (TableBits >= (sizeof(Count) / sizeof(UINT16))) {
        return (UINT16)BAD_TABLE;
    }

    //
    // Initialize Count array starting from Index 0, as there is a possibility of Count array being uninitialized.
    //
    for (Index = 0; Index <= 16; Index++) {
        Count[Index] = 0;
    }

    for (Index = 0; Index < NumOfChar; Index++) {
        if (BitLen[Index] > 16) {
            return (UINT16)BAD_TABLE;
        }
        Count[BitLen[Index]]++;
    }

    Start[0] = 0;
    Start[1] = 0;

    for (Index = 1; Index <= 16; Index++) {
        WordOfStart = Start[Index];
        WordOfCount = Count[Index];
        Start[Index + 1] = (UINT16)(WordOfStart + (WordOfCount << (16 - Index)));
    }

    if (Start[17] != 0) {
        /*(1U << 16)*/
        return (UINT16)BAD_TABLE;
    }

    JuBits = (UINT16)(16 - TableBits);

    Weight[0] = 0;
    for (Index = 1; Index <= TableBits; Index++) {
        Start[Index] >>= JuBits;
        Weight[Index] = (UINT16)(1U << (TableBits - Index));
    }

    while (Index <= 16) {
        Weight[Index] = (UINT16)(1U << (16 - Index));
        Index++;
    }

    Index = (UINT16)(Start[TableBits + 1] >> JuBits);

    if (Index != 0) {
        Index3 = (UINT16)(1U << TableBits);
        if (Index < Index3) {
            SetMem16 (Table + Index, (Index3 - Index) * sizeof(*Table), 0);
        }
    }

    Avail = NumOfChar;
    Mask = (UINT16)(1U << (15 - TableBits));
    MaxTableLength = (UINT16)(1U << TableBits);

    for (Char = 0; Char < NumOfChar; Char++) {
        Len = BitLen[Char];
        if (Len == 0 || Len >= 17) {
            continue;
        }

        NextCode = (UINT16)(Start[Len] + Weight[Len]);

        if (Len <= TableBits) {

            for (Index = Start[Len]; Index < NextCode; Index++) {
                if (Index >= MaxTableLength) {
                    return (UINT16)BAD_TABLE;
                }
                Table[Index] = Char;
            }

        }
        else {
            Index3 = Start[Len];
            Pointer = &Table[Index3 >> JuBits];
            Index = (UINT16)(Len - TableBits);

            while (Index != 0) {
                if (*Pointer == 0 && Avail < (2 * NC - 1)) {
                    Sd->mRight[Avail] = Sd->mLeft[Avail] = 0;
                    *Pointer = Avail++;
                }

                if (*Pointer < (2 * NC - 1)) {
                    if ((Index3 & Mask) != 0) {
                        Pointer = &Sd->mRight[*Pointer];
                    }
                    else {
                        Pointer = &Sd->mLeft[*Pointer];
                    }
                }

                Index3 <<= 1;
                Index--;
            }

            *Pointer = Char;

        }

        Start[Len] = NextCode;
    }
    //
    // Succeeds
    //
    return 0;
}